

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  ulong uVar6;
  ushort uVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  __m128i *ptr;
  __m128i *palVar12;
  __m128i *ptr_00;
  int64_t *ptr_01;
  ulong uVar13;
  __m128i *ptr_02;
  int iVar14;
  long lVar15;
  ulong uVar17;
  uint uVar16;
  int64_t *piVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  char *__format;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong size;
  uint uVar31;
  ulong uVar32;
  __m128i_64_t _Var33;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar34 [16];
  undefined1 extraout_XMM0_01 [16];
  int64_t iVar35;
  longlong lVar36;
  __m128i_64_t B_4;
  longlong lVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  longlong lVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar58;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar68;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar74;
  int iVar75;
  __m128i_64_t B_6;
  undefined1 auVar69 [16];
  int iVar76;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  __m128i_64_t B;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  __m128i_64_t B_1;
  undefined1 auVar86 [16];
  __m128i_64_t _Var87;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i a;
  __m128i a_00;
  __m128i alVar88;
  int local_180;
  undefined1 local_158 [16];
  __m128i_64_t A;
  long lStack_110;
  uint local_100;
  int iStack_fc;
  ulong uStack_80;
  ulong uStack_70;
  __m128i_64_t e;
  __m128i_64_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
        }
        else {
          if (-1 < gap) {
            uVar31 = uVar3 - 1;
            size = (ulong)uVar3 + 1 >> 1;
            uVar6 = (ulong)uVar31 % size;
            iVar10 = (int)(uVar31 / size) + -1;
            uVar28 = (ulong)(uint)open;
            iVar19 = -open;
            iVar51 = ppVar5->min;
            uVar29 = 0x8000000000000000 - (long)iVar51;
            if (iVar51 != iVar19 && SBORROW4(iVar51,iVar19) == iVar51 + open < 0) {
              uVar29 = uVar28 | 0x8000000000000000;
            }
            iVar51 = ppVar5->max;
            uVar30 = (uint)size;
            ppVar11 = parasail_result_new();
            if (ppVar11 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            ppVar11->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar11->flag | 0x2800802;
            ptr = parasail_memalign___m128i(0x10,size);
            palVar12 = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
            auVar73._0_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar73._4_4_ = -(uint)((int)palVar12 == 0 && (int)((ulong)palVar12 >> 0x20) == 0);
            auVar73._8_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
            auVar73._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
            iVar14 = movmskps((int)palVar12,auVar73);
            if (iVar14 != 0) {
              return (parasail_result_t *)0x0;
            }
            iVar14 = s2Len + -1;
            uVar2 = -iVar10;
            uVar32 = (ulong)(uint)gap;
            uVar13 = uVar29 + 1;
            lVar15 = 0x7ffffffffffffffe - (long)iVar51;
            _Var33.m[1]._0_4_ = (int)uVar13;
            _Var33.m[0] = uVar13;
            _Var33.m[1]._4_4_ = (int)(uVar13 >> 0x20);
            local_158._8_4_ = (int)lVar15;
            local_158._0_8_ = lVar15;
            local_158._12_4_ = (int)((ulong)lVar15 >> 0x20);
            lVar21 = (long)iVar19;
            lVar15 = lVar21;
            for (uVar17 = 0; uVar17 != size; uVar17 = uVar17 + 1) {
              lVar24 = lVar15;
              for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
                lVar27 = lVar24;
                if (s1_beg != 0) {
                  lVar27 = 0;
                }
                *(long *)((long)&h + lVar26 * 8) = lVar27;
                *(ulong *)((long)&e + lVar26 * 8) = lVar27 - uVar28;
                lVar24 = lVar24 - size * (uint)gap;
              }
              ptr[uVar17][0] = h.m[0];
              ptr[uVar17][1] = h.m[1];
              ptr_00[uVar17][0] = e.m[0];
              ptr_00[uVar17][1] = e.m[1];
              lVar15 = lVar15 - (ulong)(uint)gap;
            }
            *ptr_01 = 0;
            for (uVar17 = 1; s2Len + 1 != uVar17; uVar17 = uVar17 + 1) {
              iVar51 = 0;
              if (s2_beg == 0) {
                iVar51 = iVar19;
              }
              ptr_01[uVar17] = (long)iVar51;
              iVar19 = iVar19 - gap;
            }
            uVar25 = 0;
            uVar17 = (ulong)(uVar30 - 1) * 0x10;
            A = _Var33;
            local_180 = iVar14;
            do {
              ptr_02 = palVar12;
              uVar22 = (ulong)(uint)s2_beg;
              if (uVar25 == (uint)s2Len) {
                alVar88[0] = (ulong)uVar2;
                if (s2_end != 0) {
                  uVar17 = 0;
                  while ((int)uVar17 < (int)uVar2) {
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = A.m[0];
                    A = (__m128i_64_t)(auVar46 << 0x40);
                    uVar17 = 1;
                  }
                  uVar13 = CONCAT44(A.m[0]._4_4_,A.m[1]._0_4_);
                }
                piVar18 = ptr_01;
                uVar20 = uVar31;
                if (s1_end != 0) {
                  for (uVar17 = 0; (uVar30 & 0x3fffffff) * 2 != (int)uVar17; uVar17 = uVar17 + 1) {
                    uVar22 = uVar17 >> 1 & 0x7fffffff;
                    uVar16 = 0;
                    if ((uVar17 & 1) != 0) {
                      uVar16 = uVar30;
                    }
                    uVar16 = uVar16 + (int)uVar22;
                    piVar18 = (int64_t *)(ulong)uVar16;
                    uVar28 = uVar13;
                    uVar9 = uVar20;
                    iVar51 = local_180;
                    if (((int)uVar16 < (int)uVar3) &&
                       (uVar22 = (*ptr)[uVar17], uVar28 = uVar22, uVar9 = uVar16, iVar51 = iVar14,
                       (long)uVar22 <= (long)uVar13)) {
                      if ((int)uVar20 <= (int)uVar16) {
                        uVar16 = uVar20;
                      }
                      if (local_180 != iVar14) {
                        uVar16 = uVar20;
                      }
                      piVar18 = (int64_t *)(ulong)uVar16;
                      uVar28 = uVar13;
                      uVar9 = uVar20;
                      iVar51 = local_180;
                      if (uVar22 == uVar13) {
                        uVar9 = uVar16;
                      }
                    }
                    local_180 = iVar51;
                    uVar20 = uVar9;
                    uVar13 = uVar28;
                  }
                }
                iVar51 = (int)uVar13;
                if (s2_end == 0 && s1_end == 0) {
                  uVar17 = 0;
                  lVar41 = ptr[uVar6][0];
                  lVar42 = ptr[uVar6][1];
                  while (lVar36 = lVar41, iVar51 = (int)lVar42, uVar20 = uVar31, local_180 = iVar14,
                        (int)uVar17 < (int)uVar2) {
                    lVar41 = 0;
                    lVar42 = lVar36;
                    uVar17 = 1;
                  }
                }
                local_100 = (uint)uVar29;
                iStack_fc = (int)(uVar29 >> 0x20);
                b_01[1] = uVar17;
                b_01[0] = (longlong)piVar18;
                alVar88[1] = uVar22;
                _mm_cmpgt_epi64_rpl(alVar88,b_01);
                iVar10 = -(uint)((int)(local_100 ^ 0x80000000) < (int)(local_158._0_4_ ^ 0x80000000)
                                );
                auVar52._4_4_ = -(uint)(iStack_fc < (int)local_158._4_4_);
                iVar19 = -(uint)((int)(local_100 ^ 0x80000000) < (int)(local_158._8_4_ ^ 0x80000000)
                                );
                auVar52._12_4_ = -(uint)(iStack_fc < (int)local_158._12_4_);
                auVar43._4_4_ = iVar10;
                auVar43._0_4_ = iVar10;
                auVar43._8_4_ = iVar19;
                auVar43._12_4_ = iVar19;
                auVar60._4_4_ = -(uint)(iStack_fc == local_158._4_4_);
                auVar60._0_4_ = -(uint)(iStack_fc == local_158._4_4_);
                auVar60._8_4_ = -(uint)(iStack_fc == local_158._12_4_);
                auVar60._12_4_ = -(uint)(iStack_fc == local_158._12_4_);
                auVar52._0_4_ = auVar52._4_4_;
                auVar52._8_4_ = auVar52._12_4_;
                auVar54._8_4_ = 0xffffffff;
                auVar54._0_8_ = 0xffffffffffffffff;
                auVar54._12_4_ = 0xffffffff;
                auVar73 = auVar54 ^ (auVar52 | auVar60 & auVar43) | extraout_XMM0_01;
                if ((((((((((((((((auVar73 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar73 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar73 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar73 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar73 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar73 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar73 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar73 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar73 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar73 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar73 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar73 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar73[0xf] < '\0') {
                  *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                  iVar51 = 0;
                  local_180 = 0;
                  uVar20 = 0;
                }
                ppVar11->score = iVar51;
                ppVar11->end_query = uVar20;
                ppVar11->end_ref = local_180;
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr_02);
                parasail_free(ptr);
                return ppVar11;
              }
              iVar51 = ppVar5->mapper[(byte)s2[uVar25]];
              iVar35 = ptr_01[uVar25];
              lVar41 = ptr[uVar30 - 1][0];
              _Var87 = _Var33;
              for (uVar17 = 0; auVar73 = _DAT_008a1890, uStack_80 = (ulong)(uint)gap,
                  size * 0x10 != uVar17; uVar17 = uVar17 + 0x10) {
                plVar1 = (long *)((long)pvVar4 + uVar17 + (long)(int)(iVar51 * uVar30) * 0x10);
                auVar70._0_8_ = iVar35 + *plVar1;
                auVar70._8_8_ = lVar41 + plVar1[1];
                auVar46 = *(undefined1 (*) [16])((long)*ptr_00 + uVar17);
                auVar52 = auVar70 ^ _DAT_008a1890;
                auVar43 = auVar46 ^ _DAT_008a1890;
                iVar19 = -(uint)(auVar43._0_4_ < auVar52._0_4_);
                iVar75 = auVar43._4_4_;
                auVar59._4_4_ = -(uint)(iVar75 < auVar52._4_4_);
                iVar68 = -(uint)(auVar43._8_4_ < auVar52._8_4_);
                iVar77 = auVar43._12_4_;
                auVar59._12_4_ = -(uint)(iVar77 < auVar52._12_4_);
                auVar69._4_4_ = iVar19;
                auVar69._0_4_ = iVar19;
                auVar69._8_4_ = iVar68;
                auVar69._12_4_ = iVar68;
                auVar53._4_4_ = -(uint)(auVar52._4_4_ == iVar75);
                auVar53._12_4_ = -(uint)(auVar52._12_4_ == iVar77);
                auVar53._0_4_ = auVar53._4_4_;
                auVar53._8_4_ = auVar53._12_4_;
                auVar59._0_4_ = auVar59._4_4_;
                auVar59._8_4_ = auVar59._12_4_;
                auVar59 = auVar59 | auVar53 & auVar69;
                auVar60 = ~auVar59 & auVar46 | auVar70 & auVar59;
                auVar52 = auVar60 ^ _DAT_008a1890;
                auVar54 = (undefined1  [16])_Var87 ^ _DAT_008a1890;
                iVar19 = -(uint)(auVar54._0_4_ < auVar52._0_4_);
                iVar57 = auVar54._4_4_;
                iVar74 = -(uint)(iVar57 < auVar52._4_4_);
                iVar68 = -(uint)(auVar54._8_4_ < auVar52._8_4_);
                iVar58 = auVar54._12_4_;
                iVar76 = -(uint)(iVar58 < auVar52._12_4_);
                auVar78._4_4_ = iVar19;
                auVar78._0_4_ = iVar19;
                auVar78._8_4_ = iVar68;
                auVar78._12_4_ = iVar68;
                iVar19 = -(uint)(auVar52._4_4_ == iVar57);
                iVar68 = -(uint)(auVar52._12_4_ == iVar58);
                auVar80._4_4_ = iVar19;
                auVar80._0_4_ = iVar19;
                auVar80._8_4_ = iVar68;
                auVar80._12_4_ = iVar68;
                auVar37._4_4_ = iVar74;
                auVar37._0_4_ = iVar74;
                auVar37._8_4_ = iVar76;
                auVar37._12_4_ = iVar76;
                auVar37 = auVar37 | auVar80 & auVar78;
                auVar52 = ~auVar37 & (undefined1  [16])_Var87 | auVar60 & auVar37;
                *(undefined1 (*) [16])((long)*ptr_02 + uVar17) = auVar52;
                auVar70 = auVar52 ^ auVar73;
                auVar60 = local_158 ^ auVar73;
                iVar19 = -(uint)(auVar60._0_4_ < auVar70._0_4_);
                iVar68 = -(uint)(auVar60._4_4_ < auVar70._4_4_);
                iVar74 = -(uint)(auVar60._8_4_ < auVar70._8_4_);
                iVar76 = -(uint)(auVar60._12_4_ < auVar70._12_4_);
                auVar81._4_4_ = iVar19;
                auVar81._0_4_ = iVar19;
                auVar81._8_4_ = iVar74;
                auVar81._12_4_ = iVar74;
                auVar61._4_4_ = -(uint)(auVar60._4_4_ == auVar70._4_4_);
                auVar61._12_4_ = -(uint)(auVar60._12_4_ == auVar70._12_4_);
                auVar61._0_4_ = auVar61._4_4_;
                auVar61._8_4_ = auVar61._12_4_;
                auVar71._4_4_ = iVar68;
                auVar71._0_4_ = iVar68;
                auVar71._8_4_ = iVar76;
                auVar71._12_4_ = iVar76;
                auVar71 = auVar71 | auVar61 & auVar81;
                auVar70 = ~auVar71 & auVar52 | local_158 & auVar71;
                auVar60 = auVar70 ^ auVar73;
                iVar19 = -(uint)(auVar60._0_4_ < auVar43._0_4_);
                iVar74 = -(uint)(auVar60._4_4_ < iVar75);
                iVar68 = -(uint)(auVar60._8_4_ < auVar43._8_4_);
                iVar76 = -(uint)(auVar60._12_4_ < iVar77);
                auVar82._4_4_ = iVar19;
                auVar82._0_4_ = iVar19;
                auVar82._8_4_ = iVar68;
                auVar82._12_4_ = iVar68;
                iVar19 = -(uint)(auVar60._4_4_ == iVar75);
                iVar68 = -(uint)(auVar60._12_4_ == iVar77);
                auVar44._4_4_ = iVar19;
                auVar44._0_4_ = iVar19;
                auVar44._8_4_ = iVar68;
                auVar44._12_4_ = iVar68;
                auVar62._4_4_ = iVar74;
                auVar62._0_4_ = iVar74;
                auVar62._8_4_ = iVar76;
                auVar62._12_4_ = iVar76;
                auVar62 = auVar62 | auVar44 & auVar82;
                auVar60 = ~auVar62 & auVar46 | auVar70 & auVar62;
                auVar43 = auVar60 ^ auVar73;
                iVar19 = -(uint)(auVar43._0_4_ < auVar54._0_4_);
                iVar68 = -(uint)(auVar43._4_4_ < iVar57);
                iVar75 = -(uint)(auVar43._8_4_ < auVar54._8_4_);
                iVar77 = -(uint)(auVar43._12_4_ < iVar58);
                auVar79._4_4_ = iVar19;
                auVar79._0_4_ = iVar19;
                auVar79._8_4_ = iVar75;
                auVar79._12_4_ = iVar75;
                auVar45._4_4_ = -(uint)(auVar43._4_4_ == iVar57);
                auVar45._12_4_ = -(uint)(auVar43._12_4_ == iVar58);
                auVar45._0_4_ = auVar45._4_4_;
                auVar45._8_4_ = auVar45._12_4_;
                auVar85._4_4_ = iVar68;
                auVar85._0_4_ = iVar68;
                auVar85._8_4_ = iVar77;
                auVar85._12_4_ = iVar77;
                auVar85 = auVar85 | auVar45 & auVar79;
                local_158 = ~auVar85 & (undefined1  [16])_Var87 | auVar60 & auVar85;
                uStack_70 = (ulong)(uint)open;
                auVar38._0_8_ = auVar52._0_8_ - (ulong)(uint)open;
                auVar38._8_8_ = auVar52._8_8_ - uStack_70;
                auVar84._0_8_ = auVar46._0_8_ - uVar32;
                auVar84._8_8_ = auVar46._8_8_ - uStack_80;
                auVar46 = auVar84 ^ auVar73;
                auVar52 = auVar38 ^ auVar73;
                iVar19 = -(uint)(auVar52._0_4_ < auVar46._0_4_);
                iVar75 = auVar52._4_4_;
                auVar63._4_4_ = -(uint)(iVar75 < auVar46._4_4_);
                iVar68 = -(uint)(auVar52._8_4_ < auVar46._8_4_);
                iVar77 = auVar52._12_4_;
                auVar63._12_4_ = -(uint)(iVar77 < auVar46._12_4_);
                auVar72._4_4_ = iVar19;
                auVar72._0_4_ = iVar19;
                auVar72._8_4_ = iVar68;
                auVar72._12_4_ = iVar68;
                auVar47._4_4_ = -(uint)(auVar46._4_4_ == iVar75);
                auVar47._12_4_ = -(uint)(auVar46._12_4_ == iVar77);
                auVar47._0_4_ = auVar47._4_4_;
                auVar47._8_4_ = auVar47._12_4_;
                auVar63._0_4_ = auVar63._4_4_;
                auVar63._8_4_ = auVar63._12_4_;
                auVar63 = auVar63 | auVar47 & auVar72;
                *(undefined1 (*) [16])((long)*ptr_00 + uVar17) =
                     ~auVar63 & auVar38 | auVar84 & auVar63;
                auVar86._0_8_ = _Var87.m[0] - uVar32;
                auVar86._8_8_ = _Var87.m[1] - uStack_80;
                auVar73 = auVar86 ^ auVar73;
                iVar19 = -(uint)(auVar52._0_4_ < auVar73._0_4_);
                auVar48._4_4_ = -(uint)(iVar75 < auVar73._4_4_);
                iVar68 = -(uint)(auVar52._8_4_ < auVar73._8_4_);
                auVar48._12_4_ = -(uint)(iVar77 < auVar73._12_4_);
                auVar64._4_4_ = iVar19;
                auVar64._0_4_ = iVar19;
                auVar64._8_4_ = iVar68;
                auVar64._12_4_ = iVar68;
                iVar19 = -(uint)(auVar73._4_4_ == iVar75);
                iVar68 = -(uint)(auVar73._12_4_ == iVar77);
                auVar55._4_4_ = iVar19;
                auVar55._0_4_ = iVar19;
                auVar55._8_4_ = iVar68;
                auVar55._12_4_ = iVar68;
                auVar48._0_4_ = auVar48._4_4_;
                auVar48._8_4_ = auVar48._12_4_;
                auVar48 = auVar48 | auVar55 & auVar64;
                _Var87 = (__m128i_64_t)(auVar86 & auVar48 | ~auVar48 & auVar38);
                plVar1 = (long *)((long)*ptr + uVar17);
                iVar35 = *plVar1;
                lVar41 = plVar1[1];
              }
              for (iVar51 = 0; uVar23 = (ulong)(uint)s2_beg, piVar18 = ptr_01, uVar22 = uVar25,
                  iVar51 != 2; iVar51 = iVar51 + 1) {
                lVar15 = lVar21;
                if (s2_beg == 0) {
                  lVar15 = ptr_01[uVar25 + 1] - uVar28;
                }
                lStack_110 = _Var87.m[0];
                lVar24 = 0;
                while (auVar73 = _DAT_008a1890, size * 0x10 + 0x10 != lVar24 + 0x10) {
                  auVar46 = *(undefined1 (*) [16])((long)*ptr_02 + lVar24);
                  auVar8._8_8_ = lStack_110;
                  auVar8._0_8_ = lVar15;
                  auVar52 = auVar8 ^ _DAT_008a1890;
                  auVar43 = auVar46 ^ _DAT_008a1890;
                  iVar19 = -(uint)(auVar52._0_4_ < auVar43._0_4_);
                  iVar68 = -(uint)(auVar52._4_4_ < auVar43._4_4_);
                  iVar75 = -(uint)(auVar52._8_4_ < auVar43._8_4_);
                  iVar77 = -(uint)(auVar52._12_4_ < auVar43._12_4_);
                  auVar65._4_4_ = iVar19;
                  auVar65._0_4_ = iVar19;
                  auVar65._8_4_ = iVar75;
                  auVar65._12_4_ = iVar75;
                  auVar49._4_4_ = -(uint)(auVar43._4_4_ == auVar52._4_4_);
                  auVar49._12_4_ = -(uint)(auVar43._12_4_ == auVar52._12_4_);
                  auVar49._0_4_ = auVar49._4_4_;
                  auVar49._8_4_ = auVar49._12_4_;
                  auVar39._4_4_ = iVar68;
                  auVar39._0_4_ = iVar68;
                  auVar39._8_4_ = iVar77;
                  auVar39._12_4_ = iVar77;
                  auVar39 = auVar39 | auVar49 & auVar65;
                  auVar46 = ~auVar39 & auVar8 | auVar46 & auVar39;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar24) = auVar46;
                  auVar52 = local_158 ^ auVar73;
                  auVar73 = auVar46 ^ auVar73;
                  iVar19 = -(uint)(auVar52._0_4_ < auVar73._0_4_);
                  auVar56._4_4_ = -(uint)(auVar52._4_4_ < auVar73._4_4_);
                  iVar68 = -(uint)(auVar52._8_4_ < auVar73._8_4_);
                  auVar56._12_4_ = -(uint)(auVar52._12_4_ < auVar73._12_4_);
                  auVar66._4_4_ = iVar19;
                  auVar66._0_4_ = iVar19;
                  auVar66._8_4_ = iVar68;
                  auVar66._12_4_ = iVar68;
                  auVar83._4_4_ = -(uint)(auVar52._4_4_ == auVar73._4_4_);
                  auVar83._12_4_ = -(uint)(auVar52._12_4_ == auVar73._12_4_);
                  auVar83._0_4_ = auVar83._4_4_;
                  auVar83._8_4_ = auVar83._12_4_;
                  auVar56._0_4_ = auVar56._4_4_;
                  auVar56._8_4_ = auVar56._12_4_;
                  auVar56 = auVar56 | auVar83 & auVar66;
                  local_158 = local_158 & auVar56 | ~auVar56 & auVar46;
                  lVar15 = lVar15 - uVar32;
                  lStack_110 = lStack_110 - uStack_80;
                  b[1] = uVar17;
                  b[0] = (longlong)piVar18;
                  a[1] = uVar23;
                  a[0] = uVar22;
                  alVar88 = _mm_cmpgt_epi64_rpl(a,b);
                  piVar18 = alVar88[1];
                  uVar7 = (ushort)(SUB161(extraout_XMM0 >> 7,0) & 1) |
                          (ushort)(SUB161(extraout_XMM0 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(extraout_XMM0 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(extraout_XMM0 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(extraout_XMM0 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(extraout_XMM0 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(extraout_XMM0 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(extraout_XMM0 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(extraout_XMM0 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(extraout_XMM0 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(extraout_XMM0 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(extraout_XMM0 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(extraout_XMM0 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(extraout_XMM0 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(extraout_XMM0 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(extraout_XMM0[0xf] >> 7) << 0xf;
                  uVar17 = (ulong)uVar7;
                  lVar24 = lVar24 + 0x10;
                  if (uVar7 == 0) goto LAB_005153d7;
                }
                _Var87.m[1] = lStack_110;
                _Var87.m[0] = lVar15;
              }
LAB_005153d7:
              alVar88 = ptr_02[uVar6];
              b_00[1] = uVar17;
              b_00[0] = (longlong)piVar18;
              a_00[1] = uVar23;
              a_00[0] = uVar22;
              _mm_cmpgt_epi64_rpl(a_00,b_00);
              auVar34._8_8_ = -(ulong)(iVar10 == 0);
              auVar34._0_8_ = -(ulong)(uVar31 < uVar30);
              auVar34 = extraout_XMM0_00 & auVar34;
              auVar73 = (undefined1  [16])A ^ _DAT_008a1890;
              auVar46 = (undefined1  [16])alVar88 ^ _DAT_008a1890;
              iVar51 = -(uint)(auVar73._0_4_ < auVar46._0_4_);
              iVar68 = -(uint)(auVar73._4_4_ < auVar46._4_4_);
              iVar19 = -(uint)(auVar73._8_4_ < auVar46._8_4_);
              iVar75 = -(uint)(auVar73._12_4_ < auVar46._12_4_);
              auVar67._4_4_ = iVar51;
              auVar67._0_4_ = iVar51;
              auVar67._8_4_ = iVar19;
              auVar67._12_4_ = iVar19;
              iVar51 = -(uint)(auVar46._4_4_ == auVar73._4_4_);
              iVar19 = -(uint)(auVar46._12_4_ == auVar73._12_4_);
              auVar40._4_4_ = iVar51;
              auVar40._0_4_ = iVar51;
              auVar40._8_4_ = iVar19;
              auVar40._12_4_ = iVar19;
              auVar50._4_4_ = iVar68;
              auVar50._0_4_ = iVar68;
              auVar50._8_4_ = iVar75;
              auVar50._12_4_ = iVar75;
              auVar50 = auVar50 | auVar40 & auVar67;
              A = (__m128i_64_t)
                  (~auVar50 & (undefined1  [16])A | (undefined1  [16])alVar88 & auVar50);
              if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar34 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar34 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar34 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar34 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar34 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar34 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar34 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar34 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar34 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar34 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar34[0xf] < '\0') {
                local_180 = (int)uVar25;
              }
              uVar25 = uVar25 + 1;
              palVar12 = ptr;
              ptr = ptr_02;
            } while( true );
          }
          __format = "%s: %s must be >= 0\n";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_striped_profile_sse2_128_64");
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64_rpl(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}